

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O0

uint ** gf_matr_inv(uint **a,uint a_rows,uint a_cols)

{
  uint b;
  uint uVar1;
  uint **a_00;
  uint **ppuVar2;
  uint local_38;
  uint local_34;
  uint j;
  uint i;
  uint **a0inv;
  uint **a0;
  uint det;
  uint a_cols_local;
  uint a_rows_local;
  uint **a_local;
  
  if ((a_rows != a_cols) && (a_rows != 2)) {
    fatal((uchar *)"gf_matr_inv",(uchar *)"Ainv only for 2x2 matrices\n");
  }
  b = gf_matr_det(a,a_rows,a_cols);
  a_00 = matrix_copy(a,a_rows,a_cols);
  ppuVar2 = matrix_new(a_rows,a_cols);
  swap(*a_00,a_00[1] + 1);
  for (local_34 = 0; local_34 < a_rows; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < a_cols; local_38 = local_38 + 1) {
      uVar1 = gf_div(a_00[local_34][local_38],b);
      ppuVar2[local_34][local_38] = uVar1;
    }
  }
  matrix_free(a_00,a_rows,a_cols);
  return ppuVar2;
}

Assistant:

uint32_t **gf_matr_inv(uint32_t **a, uint32_t a_rows, uint32_t a_cols)
{
    if (a_rows != a_cols && a_rows != 2)
        fatal("gf_matr_inv", "Ainv only for 2x2 matrices\n");

    uint32_t det = gf_matr_det(a, a_rows, a_cols);

    uint32_t **a0 = matrix_copy(a, a_rows, a_cols);
    uint32_t **a0inv = matrix_new(a_rows, a_cols);

    swap(&a0[0][0], &a0[1][1]);

    for (uint32_t i = 0; i < a_rows; i++)
        for (uint32_t j = 0; j < a_cols; j++)
            a0inv[i][j] = gf_div(a0[i][j], det);

    matrix_free(a0, a_rows, a_cols);

    return a0inv;
}